

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall
DynamicTimestampCallback::buildTypeWithValue(DynamicTimestampCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar1;
  shared_ptr<TimestampType> local_28;
  DynamicTimestampCallback *this_local;
  
  this_local = this;
  (**(code **)(in_RSI + 0x18))();
  std::make_shared<TimestampType,unsigned_int>((uint *)&local_28);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>
            ((shared_ptr<BER_CONTAINER> *)this,&local_28);
  std::shared_ptr<TimestampType>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
        return std::make_shared<TimestampType>(m_callback());
    }